

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IColourImpl * Catch::anon_unknown_22::platformColourInstance(void)

{
  char cVar1;
  int iVar2;
  IMutableContext *pIVar3;
  undefined **ppuVar4;
  Ptr<const_Catch::IConfig> config;
  long *local_10;
  
  pIVar3 = getCurrentMutableContext();
  (*(pIVar3->super_IContext)._vptr_IContext[6])(&local_10,pIVar3);
  if (local_10 == (long *)0x0) {
LAB_001436c6:
    iVar2 = isatty(1);
    if (iVar2 == 0) {
      NoColourImpl::instance();
      ppuVar4 = (undefined **)&NoColourImpl::instance::s_instance;
      goto LAB_0014370f;
    }
  }
  else {
    cVar1 = (**(code **)(*local_10 + 0x80))();
    if (cVar1 == '\0') goto LAB_001436c6;
  }
  ppuVar4 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
  if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
    if (iVar2 != 0) {
      __cxa_guard_release(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
    }
  }
LAB_0014370f:
  if (local_10 != (long *)0x0) {
    (**(code **)(*local_10 + 0x18))();
  }
  return (IColourImpl *)ppuVar4;
}

Assistant:

IContext& getCurrentContext() {
        return getCurrentMutableContext();
    }